

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1.c
# Opt level: O0

int secp256k1_ec_pubkey_tweak_add_helper(secp256k1_ge *p,uchar *tweak32)

{
  int iVar1;
  int overflow;
  secp256k1_scalar term;
  secp256k1_scalar *in_stack_00000040;
  secp256k1_ge *in_stack_00000048;
  int *in_stack_ffffffffffffffd0;
  uchar *in_stack_ffffffffffffffd8;
  secp256k1_scalar *in_stack_ffffffffffffffe0;
  
  secp256k1_scalar_set_b32
            (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
  iVar1 = secp256k1_eckey_pubkey_tweak_add(in_stack_00000048,in_stack_00000040);
  return (int)(iVar1 != 0);
}

Assistant:

static int secp256k1_ec_pubkey_tweak_add_helper(secp256k1_ge *p, const unsigned char *tweak32) {
    secp256k1_scalar term;
    int overflow = 0;
    secp256k1_scalar_set_b32(&term, tweak32, &overflow);
    return !overflow && secp256k1_eckey_pubkey_tweak_add(p, &term);
}